

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> __thiscall
duckdb::StandardBufferManager::ConstructManagedBuffer
          (StandardBufferManager *this,idx_t size,idx_t block_header_size,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *source,
          FileBufferType type)

{
  long *plVar1;
  _func_int **pp_Var2;
  _Alloc_hider _Var3;
  type args;
  Allocator *args_00;
  pointer this_00;
  DBConfig *pDVar4;
  InternalException *this_01;
  _func_int **pp_Var5;
  undefined7 in_register_00000081;
  int in_R9D;
  FileBufferType type_local;
  _func_int **local_58;
  string local_50;
  idx_t block_header_size_local;
  idx_t size_local;
  
  type_local = (FileBufferType)in_R9D;
  (this->super_BufferManager)._vptr_BufferManager = (_func_int **)0x0;
  block_header_size_local = (idx_t)source;
  size_local = block_header_size;
  if (in_R9D == 1) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"ConstructManagedBuffer cannot be used to construct blocks",
               (allocator *)&local_58);
    InternalException::InternalException(this_01,&local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  plVar1 = *(long **)CONCAT71(in_register_00000081,type);
  if (plVar1 == (long *)0x0) {
    args_00 = Allocator::Get(*(DatabaseInstance **)(size + 8));
    make_uniq<duckdb::FileBuffer,duckdb::Allocator&,duckdb::FileBufferType&,unsigned_long&,unsigned_long&>
              ((duckdb *)&local_50,args_00,&type_local,&size_local,&block_header_size_local);
    _Var3._M_p = local_50._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)0x0;
    pp_Var5 = (this->super_BufferManager)._vptr_BufferManager;
    (this->super_BufferManager)._vptr_BufferManager = (_func_int **)_Var3._M_p;
    if (pp_Var5 == (_func_int **)0x0) goto LAB_00561fc1;
LAB_00561fab:
    (**(code **)(*pp_Var5 + 8))();
  }
  else {
    *(long *)CONCAT71(in_register_00000081,type) = 0;
    local_50._M_dataplus._M_p = (pointer)plVar1;
    args = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::operator*
                     ((unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                       *)&local_50);
    make_uniq<duckdb::FileBuffer,duckdb::FileBuffer&,duckdb::FileBufferType&>
              ((duckdb *)&local_58,args,&type_local);
    pp_Var2 = local_58;
    local_58 = (_func_int **)0x0;
    pp_Var5 = (this->super_BufferManager)._vptr_BufferManager;
    (this->super_BufferManager)._vptr_BufferManager = pp_Var2;
    if ((pp_Var5 != (_func_int **)0x0) &&
       ((**(code **)(*pp_Var5 + 8))(), pp_Var5 = local_58, local_58 != (_func_int **)0x0))
    goto LAB_00561fab;
  }
  if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
  }
LAB_00561fc1:
  this_00 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
            operator->((unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                        *)this);
  pDVar4 = DBConfig::GetConfig(*(DatabaseInstance **)(size + 8));
  FileBuffer::Initialize(this_00,(pDVar4->options).debug_initialize);
  return (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)
         (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)this;
}

Assistant:

unique_ptr<FileBuffer> StandardBufferManager::ConstructManagedBuffer(idx_t size, idx_t block_header_size,
                                                                     unique_ptr<FileBuffer> &&source,
                                                                     FileBufferType type) {
	unique_ptr<FileBuffer> result;
	if (type == FileBufferType::BLOCK) {
		throw InternalException("ConstructManagedBuffer cannot be used to construct blocks");
	}
	if (source) {
		auto tmp = std::move(source);
		D_ASSERT(tmp->AllocSize() == BufferManager::GetAllocSize(size + block_header_size));
		result = make_uniq<FileBuffer>(*tmp, type);
	} else {
		// non re-usable buffer: allocate a new buffer
		result = make_uniq<FileBuffer>(Allocator::Get(db), type, size, block_header_size);
	}
	result->Initialize(DBConfig::GetConfig(db).options.debug_initialize);
	return result;
}